

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool basist::transcode_uastc_to_bc7
               (unpacked_uastc_block *unpacked_src_blk,bc7_optimization_results *dst_blk)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t auVar5 [4];
  char cVar6;
  char cVar10;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [15];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [14];
  undefined1 auVar24 [15];
  undefined1 auVar25 [14];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [13];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  unkuint9 Var36;
  undefined1 auVar37 [11];
  undefined1 auVar38 [14];
  undefined1 auVar39 [15];
  undefined1 auVar40 [11];
  undefined1 auVar41 [14];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  uint6 uVar46;
  bool bVar47;
  uint8_t uVar48;
  byte bVar49;
  uint32_t i;
  uint32_t uVar50;
  long lVar51;
  uint8_t uVar52;
  uint32_t astc_comp;
  uint uVar53;
  ulong uVar54;
  uint8_t *puVar55;
  bool bVar56;
  ulong uVar57;
  ulong uVar58;
  long lVar59;
  uint uVar60;
  ulong uVar61;
  uint32_t comp;
  uint uVar62;
  bool bVar63;
  uint uVar64;
  color_quad_u8 *pcVar65;
  uint32_t i_11;
  undefined1 auVar66 [15];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ushort uVar73;
  float fVar74;
  float fVar78;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [15];
  float best_err;
  float fVar80;
  short sVar81;
  ushort uVar82;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  ushort uVar87;
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int iVar93;
  int iVar96;
  int iVar97;
  int iVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  color_quad_u8 bestMinColor;
  color_quad_u8 bestMaxColor;
  uint32_t best_pbits [2];
  float xh [4];
  float xl [4];
  color_quad_u8 local_88;
  color_quad_u8 local_84;
  uint32_t local_80 [2];
  undefined8 local_78;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [4];
  undefined8 uStack_64;
  float fStack_5c;
  color_quad_u8 *local_58;
  ulong local_50;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  undefined4 uVar83;
  undefined6 uVar84;
  
  dst_blk->m_pbits[2] = (uint32_t  [2])0x0;
  dst_blk->m_index_selector = 0;
  dst_blk->m_rotation = 0;
  dst_blk->m_pbits[0] = (uint32_t  [2])0x0;
  dst_blk->m_pbits[1] = (uint32_t  [2])0x0;
  *(undefined8 *)(dst_blk->m_low + 2) = 0;
  dst_blk->m_high[1] = (uint8_t  [4])0x0;
  dst_blk->m_high[2] = (uint8_t  [4])0x0;
  dst_blk->m_alpha_selectors[8] = '\0';
  dst_blk->m_alpha_selectors[9] = '\0';
  dst_blk->m_alpha_selectors[10] = '\0';
  dst_blk->m_alpha_selectors[0xb] = '\0';
  dst_blk->m_alpha_selectors[0xc] = '\0';
  dst_blk->m_alpha_selectors[0xd] = '\0';
  dst_blk->m_alpha_selectors[0xe] = '\0';
  dst_blk->m_alpha_selectors[0xf] = '\0';
  dst_blk->m_low[0] = (uint8_t  [4])0x0;
  dst_blk->m_low[1] = (uint8_t  [4])0x0;
  dst_blk->m_selectors[8] = '\0';
  dst_blk->m_selectors[9] = '\0';
  dst_blk->m_selectors[10] = '\0';
  dst_blk->m_selectors[0xb] = '\0';
  dst_blk->m_selectors[0xc] = '\0';
  dst_blk->m_selectors[0xd] = '\0';
  dst_blk->m_selectors[0xe] = '\0';
  dst_blk->m_selectors[0xf] = '\0';
  dst_blk->m_alpha_selectors[0] = '\0';
  dst_blk->m_alpha_selectors[1] = '\0';
  dst_blk->m_alpha_selectors[2] = '\0';
  dst_blk->m_alpha_selectors[3] = '\0';
  dst_blk->m_alpha_selectors[4] = '\0';
  dst_blk->m_alpha_selectors[5] = '\0';
  dst_blk->m_alpha_selectors[6] = '\0';
  dst_blk->m_alpha_selectors[7] = '\0';
  dst_blk->m_mode = 0;
  dst_blk->m_partition = 0;
  dst_blk->m_selectors[0] = '\0';
  dst_blk->m_selectors[1] = '\0';
  dst_blk->m_selectors[2] = '\0';
  dst_blk->m_selectors[3] = '\0';
  dst_blk->m_selectors[4] = '\0';
  dst_blk->m_selectors[5] = '\0';
  dst_blk->m_selectors[6] = '\0';
  dst_blk->m_selectors[7] = '\0';
  uVar53 = unpacked_src_blk->m_mode;
  uVar54 = (ulong)uVar53;
  if (0x12 < uVar54) {
    return false;
  }
  bVar1 = g_uastc_mode_endpoint_ranges[uVar54];
  bVar49 = g_uastc_mode_comps[uVar54];
  switch(uVar54) {
  default:
    dst_blk->m_mode = 6;
    local_68 = (undefined1  [4])
               ((float)(byte)g_astc_unquant
                             [(ulong)(unpacked_src_blk->m_astc).m_endpoints[0] * 2 +
                              (ulong)bVar1 * 0x200] / 255.0);
    if (uVar54 - 0xf < 3) {
      fStack_70 = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[1] * 2 +
                                (ulong)bVar1 * 0x200] / 255.0;
      uStack_64._0_4_ = (float)local_68;
      local_78 = CONCAT44(fStack_70,fStack_70);
      uStack_64._4_4_ = (float)local_68;
      fStack_5c = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[2] * 2 +
                                (ulong)bVar1 * 0x200] / 255.0;
      fStack_6c = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[3] * 2 +
                                (ulong)bVar1 * 0x200] / 255.0;
      bVar49 = 4;
    }
    else {
      auVar67._0_4_ =
           (float)(byte)g_astc_unquant
                        [(ulong)(unpacked_src_blk->m_astc).m_endpoints[2] * 2 + (ulong)bVar1 * 0x200
                        ];
      auVar67._4_4_ =
           (float)(byte)g_astc_unquant
                        [(ulong)(unpacked_src_blk->m_astc).m_endpoints[4] * 2 + (ulong)bVar1 * 0x200
                        ];
      auVar67._8_8_ = 0;
      auVar68 = divps(auVar67,_DAT_001e3930);
      uStack_64 = auVar68._0_8_;
      auVar69._0_4_ =
           (float)(byte)g_astc_unquant
                        [(ulong)(unpacked_src_blk->m_astc).m_endpoints[1] * 2 + (ulong)bVar1 * 0x200
                        ];
      auVar69._4_4_ =
           (float)(byte)g_astc_unquant
                        [(ulong)(unpacked_src_blk->m_astc).m_endpoints[3] * 2 + (ulong)bVar1 * 0x200
                        ];
      auVar69._8_8_ = 0;
      auVar68 = divps(auVar69,_DAT_001e3930);
      local_78 = auVar68._0_8_;
      fStack_70 = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[5] * 2 +
                                (ulong)bVar1 * 0x200] / 255.0;
      if (uVar54 - 8 < 7) {
        fStack_5c = (float)(byte)g_astc_unquant
                                 [(ulong)(unpacked_src_blk->m_astc).m_endpoints[6] * 2 +
                                  (ulong)bVar1 * 0x200] / 255.0;
        fStack_6c = (float)(byte)g_astc_unquant
                                 [(ulong)(unpacked_src_blk->m_astc).m_endpoints[7] * 2 +
                                  (ulong)bVar1 * 0x200] / 255.0;
      }
      else {
        fStack_5c = 1.0;
        fStack_6c = 1.0;
      }
    }
    determine_unique_pbits
              ((uint)bVar49,7,(float *)local_68,(float *)&local_78,&local_88,&local_84,local_80);
    *&dst_blk->m_low[0].m_c = local_88.m_c;
    *&dst_blk->m_high[0].m_c = local_84.m_c;
    if (uVar54 - 0x12 < 0xfffffffffffffff6) {
      dst_blk->m_low[0].m_c[3] = '\x7f';
      dst_blk->m_high[0].m_c[3] = '\x7f';
    }
    dst_blk->m_pbits[0] = local_80;
    if ((int)uVar53 < 0xe) {
      if ((uVar53 == 5) || (uVar53 == 0xc)) {
        lVar51 = 0;
        do {
          dst_blk->m_selectors[lVar51] =
               (&DAT_00265b68)[(unpacked_src_blk->m_astc).m_weights[lVar51]];
          lVar51 = lVar51 + 1;
        } while (lVar51 != 0x10);
        return true;
      }
    }
    else {
      if (uVar53 == 0x12) {
        lVar51 = 0;
        do {
          dst_blk->m_selectors[lVar51] =
               (&DAT_00265ba0)[(unpacked_src_blk->m_astc).m_weights[lVar51]];
          lVar51 = lVar51 + 1;
        } while (lVar51 != 0x10);
        return true;
      }
      if (uVar53 == 0xe) {
        lVar51 = 0;
        do {
          dst_blk->m_selectors[lVar51] =
               (&DAT_001e3b5c)[(unpacked_src_blk->m_astc).m_weights[lVar51]];
          lVar51 = lVar51 + 1;
        } while (lVar51 != 0x10);
        return true;
      }
    }
    lVar51 = 0;
    do {
      dst_blk->m_selectors[lVar51] = (unpacked_src_blk->m_astc).m_weights[lVar51];
      lVar51 = lVar51 + 1;
    } while (lVar51 != 0x10);
    break;
  case 1:
    dst_blk->m_mode = 3;
    auVar16 = DAT_001e3650._0_15_;
    auVar68 = psllw(ZEXT116((unpacked_src_blk->m_astc).m_endpoints[2]),8);
    auVar79 = ~auVar16 & auVar68._0_15_ |
              SUB1615(*(undefined1 (*) [16])(unpacked_src_blk->m_astc).m_endpoints,0) & auVar16;
    auVar66[0xd] = 0;
    auVar66._0_13_ = auVar79._0_13_;
    auVar66[0xe] = auVar79[7];
    auVar19[0xc] = auVar79[6];
    auVar19._0_12_ = auVar79._0_12_;
    auVar19._13_2_ = auVar66._13_2_;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar79._0_11_;
    auVar20._12_3_ = auVar19._12_3_;
    auVar22[10] = auVar79[5];
    auVar22._0_10_ = auVar79._0_10_;
    auVar22._11_4_ = auVar20._11_4_;
    auVar26[9] = 0;
    auVar26._0_9_ = auVar79._0_9_;
    auVar26._10_5_ = auVar22._10_5_;
    auVar28[8] = auVar79[4];
    auVar28._0_8_ = auVar79._0_8_;
    auVar28._9_6_ = auVar26._9_6_;
    auVar35._7_8_ = 0;
    auVar35._0_7_ = auVar28._8_7_;
    Var36 = CONCAT81(SUB158(auVar35 << 0x40,7),auVar79[3]);
    auVar42._9_6_ = 0;
    auVar42._0_9_ = Var36;
    auVar37._1_10_ = SUB1510(auVar42 << 0x30,5);
    auVar37[0] = auVar79[2];
    auVar43._11_4_ = 0;
    auVar43._0_11_ = auVar37;
    auVar31[2] = auVar79[1];
    auVar31._0_2_ = auVar79._0_2_;
    auVar31._3_12_ = SUB1512(auVar43 << 0x20,3);
    auVar33._2_13_ = auVar31._2_13_;
    auVar33._0_2_ = auVar79._0_2_ & 0xff;
    auVar17._10_2_ = 0;
    auVar17._0_10_ = auVar33._0_10_;
    auVar17._12_2_ = (short)Var36;
    uVar46 = CONCAT42(auVar17._10_4_,auVar37._0_2_);
    auVar38._6_8_ = 0;
    auVar38._0_6_ = uVar46;
    auVar23._4_2_ = auVar31._2_2_;
    auVar23._0_4_ = auVar33._0_4_;
    auVar23._6_8_ = SUB148(auVar38 << 0x40,6);
    auVar75._0_4_ = (float)(auVar33._0_4_ & 0xffff);
    auVar75._4_4_ = (float)auVar23._4_4_;
    auVar75._8_4_ = (float)(int)uVar46;
    auVar75._12_4_ = (float)(auVar17._10_4_ >> 0x10);
    auVar68 = divps(auVar75,_DAT_001e3930);
    uStack_64._4_4_ = (float)(unpacked_src_blk->m_astc).m_endpoints[4] / 255.0;
    _local_68 = auVar68._0_8_;
    fStack_5c = 1.0;
    auVar68 = psllw(ZEXT416(*(uint *)((unpacked_src_blk->m_astc).m_endpoints + 3)),8);
    auVar66 = ~auVar16 & auVar68._0_15_ |
              SUB1615(*(undefined1 (*) [16])((unpacked_src_blk->m_astc).m_endpoints + 1),0) &
              auVar16;
    auVar16[0xd] = 0;
    auVar16._0_13_ = auVar66._0_13_;
    auVar16[0xe] = auVar66[7];
    auVar79[0xc] = auVar66[6];
    auVar79._0_12_ = auVar66._0_12_;
    auVar79._13_2_ = auVar16._13_2_;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar66._0_11_;
    auVar21._12_3_ = auVar79._12_3_;
    auVar24[10] = auVar66[5];
    auVar24._0_10_ = auVar66._0_10_;
    auVar24._11_4_ = auVar21._11_4_;
    auVar27[9] = 0;
    auVar27._0_9_ = auVar66._0_9_;
    auVar27._10_5_ = auVar24._10_5_;
    auVar29[8] = auVar66[4];
    auVar29._0_8_ = auVar66._0_8_;
    auVar29._9_6_ = auVar27._9_6_;
    auVar39._7_8_ = 0;
    auVar39._0_7_ = auVar29._8_7_;
    Var36 = CONCAT81(SUB158(auVar39 << 0x40,7),auVar66[3]);
    auVar44._9_6_ = 0;
    auVar44._0_9_ = Var36;
    auVar40._1_10_ = SUB1510(auVar44 << 0x30,5);
    auVar40[0] = auVar66[2];
    auVar45._11_4_ = 0;
    auVar45._0_11_ = auVar40;
    auVar32[2] = auVar66[1];
    auVar32._0_2_ = auVar66._0_2_;
    auVar32._3_12_ = SUB1512(auVar45 << 0x20,3);
    auVar34._2_13_ = auVar32._2_13_;
    auVar34._0_2_ = auVar66._0_2_ & 0xff;
    auVar18._10_2_ = 0;
    auVar18._0_10_ = auVar34._0_10_;
    auVar18._12_2_ = (short)Var36;
    uVar46 = CONCAT42(auVar18._10_4_,auVar40._0_2_);
    auVar41._6_8_ = 0;
    auVar41._0_6_ = uVar46;
    auVar25._4_2_ = auVar32._2_2_;
    auVar25._0_4_ = auVar34._0_4_;
    auVar25._6_8_ = SUB148(auVar41 << 0x40,6);
    auVar72._0_4_ = (float)(auVar34._0_4_ & 0xffff);
    auVar72._4_4_ = (float)auVar25._4_4_;
    auVar72._8_4_ = (float)(int)uVar46;
    auVar72._12_4_ = (float)(auVar18._10_4_ >> 0x10);
    auVar68 = divps(auVar72,_DAT_001e3930);
    local_78 = auVar68._0_8_;
    fStack_70 = (float)(unpacked_src_blk->m_astc).m_endpoints[5] / 255.0;
    fStack_6c = 1.0;
    lVar51 = 0;
    local_88.m_c[0] = '\0';
    local_88.m_c[1] = '\0';
    local_88.m_c[2] = '\0';
    local_88.m_c[3] = '\0';
    local_84.m_c[0] = '\0';
    local_84.m_c[1] = '\0';
    local_84.m_c[2] = '\0';
    local_84.m_c[3] = '\0';
    determine_unique_pbits(3,7,(float *)local_68,(float *)&local_78,&local_88,&local_84,local_80);
    dst_blk->m_low[0].m_c[2] = local_88.m_c[2];
    *(undefined2 *)dst_blk->m_low[0].m_c = local_88.m_c._0_2_;
    *(undefined2 *)dst_blk->m_low[1].m_c = local_88.m_c._0_2_;
    dst_blk->m_low[1].m_c[2] = local_88.m_c[2];
    do {
      uVar48 = local_84.m_c[lVar51];
      dst_blk->m_high[0].m_c[lVar51] = uVar48;
      dst_blk->m_high[1].m_c[lVar51] = uVar48;
      lVar51 = lVar51 + 1;
    } while (lVar51 != 3);
    dst_blk->m_pbits[0][0] = local_80[0];
    dst_blk->m_pbits[0][1] = local_80[1];
    dst_blk->m_pbits[1][0] = local_80[0];
    dst_blk->m_pbits[1][1] = local_80[1];
    lVar51 = 0;
    do {
      dst_blk->m_selectors[lVar51] = (unpacked_src_blk->m_astc).m_weights[lVar51];
      lVar51 = lVar51 + 1;
    } while (lVar51 != 0x10);
    break;
  case 2:
    dst_blk->m_mode = 1;
    dst_blk->m_partition =
         (uint)(byte)g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6];
    auVar71 = _DAT_001e3930;
    auVar68 = _DAT_001e36f0;
    bVar1 = g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
    fStack_5c = 1.0;
    uVar54 = 0;
    bVar47 = true;
    do {
      bVar56 = bVar47;
      lVar51 = 0;
      do {
        uVar53 = (uint)(unpacked_src_blk->m_astc).m_endpoints[lVar51 * 2 + uVar54 * 6];
        *(float *)(local_68 + lVar51 * 4) = (float)(uVar53 << 4 | uVar53) / 255.0;
        uVar53 = (uint)(unpacked_src_blk->m_astc).m_endpoints[lVar51 * 2 + uVar54 * 6 + 1];
        *(float *)((long)&local_78 + lVar51 * 4) = (float)(uVar53 << 4 | uVar53) / 255.0;
        lVar51 = lVar51 + 1;
      } while (lVar51 != 3);
      uVar53 = 0;
      uVar62 = 0;
      uVar50 = 0;
      uVar60 = 0;
      fVar80 = 1e+09;
      bVar47 = true;
      do {
        bVar63 = bVar47;
        fVar88 = (float)uVar60;
        uVar64 = uVar60 | 0x7e;
        auVar90._4_4_ = uVar60;
        auVar90._0_4_ = uVar60;
        auVar90._8_4_ = uVar60;
        auVar90._12_4_ = uVar60;
        auVar76._0_8_ = CONCAT44(uVar60,uVar60) | 0x7e0000007e;
        auVar76._8_4_ = uVar64;
        auVar76._12_4_ = uVar64;
        iVar93 = (int)(((float)local_68 * 127.0 - fVar88) * 0.5 + 0.5);
        iVar96 = (int)(((float)uStack_64 * 127.0 - fVar88) * 0.5 + 0.5);
        iVar97 = (int)((uStack_64._4_4_ * 127.0 - fVar88) * 0.5 + 0.5);
        iVar98 = (int)((fStack_5c * 127.0 - fVar88) * 0.5 + 0.5);
        auVar85._0_4_ = -(uint)(iVar93 < 0);
        auVar85._4_4_ = -(uint)(iVar96 < 0);
        auVar85._8_4_ = -(uint)(iVar97 < 0);
        auVar85._12_4_ = -(uint)(iVar98 < 0);
        auVar94._4_4_ = iVar96 * 2;
        auVar94._0_4_ = iVar93 * 2;
        auVar94._8_4_ = iVar97 * 2;
        auVar94._12_4_ = iVar98 * 2;
        auVar94 = auVar94 | auVar90;
        auVar91._0_4_ = -(uint)(auVar94._0_4_ < (int)uVar64);
        auVar91._4_4_ = -(uint)(auVar94._4_4_ < (int)uVar64);
        auVar91._8_4_ = -(uint)(auVar94._8_4_ < (int)uVar64);
        auVar91._12_4_ = -(uint)(auVar94._12_4_ < (int)uVar64);
        auVar86 = (~auVar85 & (~auVar91 & auVar76 | auVar94 & auVar91) | auVar90 & auVar85) &
                  auVar68;
        sVar14 = auVar86._0_2_;
        cVar6 = (0 < sVar14) * (sVar14 < 0x100) * auVar86[0] - (0xff < sVar14);
        sVar14 = auVar86._2_2_;
        sVar81 = CONCAT11((0 < sVar14) * (sVar14 < 0x100) * auVar86[2] - (0xff < sVar14),cVar6);
        sVar14 = auVar86._4_2_;
        cVar7 = (0 < sVar14) * (sVar14 < 0x100) * auVar86[4] - (0xff < sVar14);
        sVar14 = auVar86._6_2_;
        uVar83 = CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar86[6] - (0xff < sVar14),
                          CONCAT12(cVar7,sVar81));
        sVar14 = auVar86._8_2_;
        cVar8 = (0 < sVar14) * (sVar14 < 0x100) * auVar86[8] - (0xff < sVar14);
        sVar14 = auVar86._10_2_;
        uVar84 = CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar86[10] - (0xff < sVar14),
                          CONCAT14(cVar8,uVar83));
        sVar14 = auVar86._12_2_;
        cVar9 = (0 < sVar14) * (sVar14 < 0x100) * auVar86[0xc] - (0xff < sVar14);
        sVar15 = auVar86._14_2_;
        cVar6 = (0 < sVar81) * (sVar81 < 0x100) * cVar6 - (0xff < sVar81);
        sVar14 = (short)((uint)uVar83 >> 0x10);
        cVar7 = (0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14);
        uVar82 = CONCAT11(cVar7,cVar6);
        sVar14 = (short)((uint6)uVar84 >> 0x20);
        cVar8 = (0 < sVar14) * (sVar14 < 0x100) * cVar8 - (0xff < sVar14);
        sVar14 = (short)(CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar86[0xe] - (0xff < sVar15),
                                  CONCAT16(cVar9,uVar84)) >> 0x30);
        cVar9 = (0 < sVar14) * (sVar14 < 0x100) * cVar9 - (0xff < sVar14);
        iVar93 = (int)(((float)local_78 * 127.0 - fVar88) * 0.5 + 0.5);
        iVar96 = (int)((local_78._4_4_ * 127.0 - fVar88) * 0.5 + 0.5);
        iVar97 = (int)((fStack_70 * 127.0 - fVar88) * 0.5 + 0.5);
        iVar98 = (int)((127.0 - fVar88) * 0.5 + 0.5);
        auVar89._0_4_ = -(uint)(iVar93 < 0);
        auVar89._4_4_ = -(uint)(iVar96 < 0);
        auVar89._8_4_ = -(uint)(iVar97 < 0);
        auVar89._12_4_ = -(uint)(iVar98 < 0);
        auVar92._4_4_ = iVar96 * 2;
        auVar92._0_4_ = iVar93 * 2;
        auVar92._8_4_ = iVar97 * 2;
        auVar92._12_4_ = iVar98 * 2;
        auVar92 = auVar92 | auVar90;
        auVar95._0_4_ = -(uint)(auVar92._0_4_ < (int)uVar64);
        auVar95._4_4_ = -(uint)(auVar92._4_4_ < (int)uVar64);
        auVar95._8_4_ = -(uint)(auVar92._8_4_ < (int)uVar64);
        auVar95._12_4_ = -(uint)(auVar92._12_4_ < (int)uVar64);
        auVar86 = (~auVar89 & (~auVar95 & auVar76 | auVar92 & auVar95) | auVar90 & auVar89) &
                  auVar68;
        sVar14 = auVar86._0_2_;
        cVar10 = (0 < sVar14) * (sVar14 < 0x100) * auVar86[0] - (0xff < sVar14);
        sVar14 = auVar86._2_2_;
        sVar81 = CONCAT11((0 < sVar14) * (sVar14 < 0x100) * auVar86[2] - (0xff < sVar14),cVar10);
        sVar14 = auVar86._4_2_;
        cVar11 = (0 < sVar14) * (sVar14 < 0x100) * auVar86[4] - (0xff < sVar14);
        sVar14 = auVar86._6_2_;
        uVar83 = CONCAT13((0 < sVar14) * (sVar14 < 0x100) * auVar86[6] - (0xff < sVar14),
                          CONCAT12(cVar11,sVar81));
        sVar14 = auVar86._8_2_;
        cVar12 = (0 < sVar14) * (sVar14 < 0x100) * auVar86[8] - (0xff < sVar14);
        sVar14 = auVar86._10_2_;
        uVar84 = CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar86[10] - (0xff < sVar14),
                          CONCAT14(cVar12,uVar83));
        sVar14 = auVar86._12_2_;
        cVar13 = (0 < sVar14) * (sVar14 < 0x100) * auVar86[0xc] - (0xff < sVar14);
        sVar15 = auVar86._14_2_;
        cVar10 = (0 < sVar81) * (sVar81 < 0x100) * cVar10 - (0xff < sVar81);
        sVar14 = (short)((uint)uVar83 >> 0x10);
        cVar11 = (0 < sVar14) * (sVar14 < 0x100) * cVar11 - (0xff < sVar14);
        uVar87 = CONCAT11(cVar11,cVar10);
        sVar14 = (short)((uint6)uVar84 >> 0x20);
        cVar12 = (0 < sVar14) * (sVar14 < 0x100) * cVar12 - (0xff < sVar14);
        sVar14 = (short)(CONCAT17((0 < sVar15) * (sVar15 < 0x100) * auVar86[0xe] - (0xff < sVar15),
                                  CONCAT16(cVar13,uVar84)) >> 0x30);
        cVar13 = (0 < sVar14) * (sVar14 < 0x100) * cVar13 - (0xff < sVar14);
        uVar73 = CONCAT11(cVar7 * '\x02',cVar6 * '\x02');
        uVar64 = CONCAT13(cVar9 * '\x02',CONCAT12(cVar8 * '\x02',uVar73));
        local_80[0] = CONCAT22((ushort)(uVar64 >> 0x17),uVar73 >> 7) & 0x1010101 | uVar64;
        uVar73 = CONCAT11(cVar11 * '\x02',cVar10 * '\x02');
        uVar64 = CONCAT13(cVar13 * '\x02',CONCAT12(cVar12 * '\x02',uVar73));
        auVar5 = (uint8_t  [4])(CONCAT22((ushort)(uVar64 >> 0x17),uVar73 >> 7) & 0x1010101 | uVar64)
        ;
        local_88.m_c[0] = auVar5[0];
        local_88.m_c[1] = auVar5[1];
        local_88.m_c[2] = auVar5[2];
        local_88.m_c[3] = auVar5[3];
        fVar88 = 0.0;
        lVar51 = 0;
        do {
          auVar77._0_4_ = (float)*(byte *)((long)local_80 + lVar51);
          auVar77._4_4_ = (float)local_88.m_c[lVar51];
          auVar77._8_8_ = 0;
          auVar86 = divps(auVar77,auVar71);
          fVar74 = auVar86._0_4_ - *(float *)(local_68 + lVar51 * 4);
          fVar78 = auVar86._4_4_ - *(float *)((long)&local_78 + lVar51 * 4);
          fVar88 = fVar88 + fVar78 * fVar78 + fVar74 * fVar74;
          lVar51 = lVar51 + 1;
        } while (lVar51 != 3);
        if (fVar88 < fVar80) {
          uVar53 = CONCAT22((ushort)(CONCAT13(cVar9,CONCAT12(cVar8,uVar82)) >> 0x11),uVar82 >> 1) &
                   0x7f7f7f7f;
          uVar62 = CONCAT22((ushort)(CONCAT13(cVar13,CONCAT12(cVar12,uVar87)) >> 0x11),uVar87 >> 1)
                   & 0x7f7f7f7f;
          fVar80 = fVar88;
          uVar50 = uVar60;
        }
        uVar60 = 1;
        bVar47 = false;
      } while (bVar63);
      uVar54 = uVar54 ^ bVar1;
      *(short *)dst_blk->m_low[uVar54].m_c = (short)uVar53;
      dst_blk->m_low[uVar54].m_c[2] = (uint8_t)(uVar53 >> 0x10);
      *(short *)dst_blk->m_high[uVar54].m_c = (short)uVar62;
      dst_blk->m_high[uVar54].m_c[2] = (uint8_t)(uVar62 >> 0x10);
      dst_blk->m_pbits[uVar54][0] = uVar50;
      uVar54 = 1;
      bVar47 = false;
    } while (bVar56);
    lVar51 = 0;
    do {
      dst_blk->m_selectors[lVar51] = (unpacked_src_blk->m_astc).m_weights[lVar51];
      lVar51 = lVar51 + 1;
    } while (lVar51 != 0x10);
    break;
  case 3:
    dst_blk->m_mode = 2;
    dst_blk->m_partition =
         (uint)(byte)g_astc_bc7_common_partitions3[(ulong)unpacked_src_blk->m_common_pattern * 6];
    bVar49 = g_astc_bc7_common_partitions3[(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
    puVar55 = (unpacked_src_blk->m_astc).m_endpoints + 1;
    lVar51 = 0;
    do {
      bVar2 = g_astc_to_bc7_partition_index_perm_tables[lVar51 + (ulong)bVar49 * 3];
      lVar59 = 0;
      do {
        bVar3 = g_astc_unquant[(ulong)puVar55[lVar59 * 2 + -1] * 2 + (ulong)bVar1 * 0x200];
        bVar4 = g_astc_unquant[(ulong)puVar55[lVar59 * 2] * 2 + (ulong)bVar1 * 0x200];
        dst_blk->m_low[bVar2].m_c[lVar59] =
             (uint8_t)((((uint)bVar3 * 0x20 - (uint)bVar3) + 0x7f & 0xffff) * 0x4041 >> 0x16);
        dst_blk->m_high[bVar2].m_c[lVar59] =
             (uint8_t)((((uint)bVar4 * 0x20 - (uint)bVar4) + 0x7f & 0xffff) * 0x4041 >> 0x16);
        lVar59 = lVar59 + 1;
      } while (lVar59 != 3);
      lVar51 = lVar51 + 1;
      puVar55 = puVar55 + 6;
    } while (lVar51 != 3);
    lVar51 = 0;
    do {
      dst_blk->m_selectors[lVar51] = (unpacked_src_blk->m_astc).m_weights[lVar51];
      lVar51 = lVar51 + 1;
    } while (lVar51 != 0x10);
    break;
  case 4:
    dst_blk->m_mode = 3;
    dst_blk->m_partition =
         (uint)(byte)g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6];
    local_50 = (ulong)(byte)g_astc_bc7_common_partitions2
                            [(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
    fStack_5c = 1.0;
    fStack_6c = 1.0;
    local_58 = dst_blk->m_low;
    local_48 = (unpacked_src_blk->m_astc).m_endpoints + 1;
    uVar54 = 0;
    bVar47 = true;
    do {
      bVar56 = bVar47;
      lVar51 = 0;
      do {
        *(float *)(local_68 + lVar51 * 4) =
             (float)(byte)g_astc_unquant
                          [(ulong)local_48[lVar51 * 2 + uVar54 * 6 + -1] * 2 + (ulong)bVar1 * 0x200]
             / 255.0;
        *(float *)((long)&local_78 + lVar51 * 4) =
             (float)(byte)g_astc_unquant
                          [(ulong)local_48[lVar51 * 2 + uVar54 * 6] * 2 + (ulong)bVar1 * 0x200] /
             255.0;
        lVar51 = lVar51 + 1;
      } while (lVar51 != 3);
      local_80[0] = 0;
      local_80[1] = 0;
      local_88.m_c[0] = '\0';
      local_88.m_c[1] = '\0';
      local_88.m_c[2] = '\0';
      local_88.m_c[3] = '\0';
      local_84.m_c[0] = '\0';
      local_84.m_c[1] = '\0';
      local_84.m_c[2] = '\0';
      local_84.m_c[3] = '\0';
      determine_unique_pbits(3,7,(float *)local_68,(float *)&local_78,&local_88,&local_84,local_80);
      uVar54 = uVar54 ^ local_50;
      local_58[uVar54].m_c[2] = local_88.m_c[2];
      *(undefined2 *)local_58[uVar54].m_c = local_88.m_c._0_2_;
      dst_blk->m_high[uVar54].m_c[2] = local_84.m_c[2];
      *(undefined2 *)dst_blk->m_high[uVar54].m_c = local_84.m_c._0_2_;
      dst_blk->m_low[uVar54].m_c[3] = '\x7f';
      dst_blk->m_high[uVar54].m_c[3] = '\x7f';
      dst_blk->m_pbits[uVar54] = local_80;
      uVar54 = 1;
      bVar47 = false;
    } while (bVar56);
    lVar51 = 0;
    do {
      dst_blk->m_selectors[lVar51] = (unpacked_src_blk->m_astc).m_weights[lVar51];
      lVar51 = lVar51 + 1;
    } while (lVar51 != 0x10);
    break;
  case 6:
  case 0xb:
  case 0xd:
  case 0x11:
    dst_blk->m_mode = 5;
    dst_blk->m_rotation = (unpacked_src_blk->m_astc).m_ccs + 1U & 3;
    if (uVar54 - 0xf < 3) {
      if ((unpacked_src_blk->m_astc).m_ccs != 3) {
        __assert_fail("unpacked_src_blk.m_astc.m_ccs == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x3379,
                      "bool basist::transcode_uastc_to_bc7(const unpacked_uastc_block &, bc7_optimization_results &)"
                     );
      }
      uVar52 = (uint8_t)(((uint)(byte)g_astc_unquant
                                      [(ulong)(unpacked_src_blk->m_astc).m_endpoints[0] * 2 +
                                       (ulong)bVar1 * 0x200] * 0x7f + 0x7f) / 0xff);
      dst_blk->m_low[0].m_c[0] = uVar52;
      uVar48 = (uint8_t)(((uint)(byte)g_astc_unquant
                                      [(ulong)(unpacked_src_blk->m_astc).m_endpoints[1] * 2 +
                                       (ulong)bVar1 * 0x200] * 0x7f + 0x7f) / 0xff);
      dst_blk->m_high[0].m_c[0] = uVar48;
      dst_blk->m_low[0].m_c[1] = uVar52;
      dst_blk->m_high[0].m_c[1] = uVar48;
      dst_blk->m_low[0].m_c[2] = uVar52;
      dst_blk->m_high[0].m_c[2] = uVar48;
      dst_blk->m_low[0].m_c[3] =
           g_astc_unquant
           [(ulong)(unpacked_src_blk->m_astc).m_endpoints[2] * 2 + (ulong)bVar1 * 0x200];
      dst_blk->m_high[0].m_c[3] =
           g_astc_unquant
           [(ulong)(unpacked_src_blk->m_astc).m_endpoints[3] * 2 + (ulong)bVar1 * 0x200];
    }
    else {
      uVar54 = 0;
      do {
        uVar62 = (unpacked_src_blk->m_astc).m_ccs;
        uVar60 = (uint)uVar54;
        if (uVar54 == 3) {
          uVar60 = uVar62;
        }
        if (uVar54 == uVar62) {
          uVar60 = 3;
        }
        uVar62 = 0xff;
        uVar64 = 0xff;
        if (uVar54 < bVar49) {
          uVar62 = (uint)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 2] * 2 +
                                (ulong)bVar1 * 0x200];
          uVar64 = (uint)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 2 + 1] * 2 +
                                (ulong)bVar1 * 0x200];
        }
        if (uVar60 < 3) {
          uVar62 = (uVar62 * 0x7f + 0x7f) / 0xff;
          uVar64 = (uVar64 * 0x7f + 0x7f) / 0xff;
        }
        dst_blk->m_low[0].m_c[uVar60] = (uint8_t)uVar62;
        dst_blk->m_high[0].m_c[uVar60] = (uint8_t)uVar64;
        uVar54 = uVar54 + 1;
      } while (uVar54 != 4);
    }
    lVar51 = 0;
    if (uVar53 == 0xd) {
      do {
        dst_blk->m_selectors[lVar51] =
             ((unpacked_src_blk->m_astc).m_weights[lVar51 * 2] != '\0') * '\x03';
        dst_blk->m_alpha_selectors[lVar51] =
             ((unpacked_src_blk->m_astc).m_weights[lVar51 * 2 + 1] != '\0') * '\x03';
        lVar51 = lVar51 + 1;
      } while (lVar51 != 0x10);
    }
    else {
      do {
        dst_blk->m_selectors[lVar51] = (unpacked_src_blk->m_astc).m_weights[lVar51 * 2];
        dst_blk->m_alpha_selectors[lVar51] = (unpacked_src_blk->m_astc).m_weights[lVar51 * 2 + 1];
        lVar51 = lVar51 + 1;
      } while (lVar51 != 0x10);
    }
    break;
  case 7:
    dst_blk->m_mode = 2;
    dst_blk->m_partition =
         (uint)(byte)g_bc7_3_astc2_common_partitions[(ulong)unpacked_src_blk->m_common_pattern * 6];
    local_50 = CONCAT44(local_50._4_4_,
                        (uint)(byte)g_bc7_3_astc2_common_partitions
                                    [(ulong)unpacked_src_blk->m_common_pattern * 6 + 4]);
    pcVar65 = dst_blk->m_high;
    local_58 = (color_quad_u8 *)((unpacked_src_blk->m_astc).m_endpoints + 1);
    lVar51 = 0;
    do {
      uVar50 = bc7_convert_partition_index_3_to_2((uint32_t)lVar51,(uint32_t)local_50);
      lVar59 = 0;
      do {
        pcVar65[-3].m_c[lVar59] =
             (uint8_t)(((uint)(byte)g_astc_unquant
                                    [(ulong)*(uint8_t *)
                                             ((long)local_58 +
                                             lVar59 * 2 + ((ulong)(uVar50 * 6) - 1)) * 2 +
                                     (ulong)bVar1 * 0x200] * 0x1f + 0x7f) / 0xff);
        pcVar65->m_c[lVar59] =
             (uint8_t)(((uint)(byte)g_astc_unquant
                                    [(ulong)*(uint8_t *)
                                             ((long)local_58 + lVar59 * 2 + (ulong)(uVar50 * 6)) * 2
                                     + (ulong)bVar1 * 0x200] * 0x1f + 0x7f) / 0xff);
        lVar59 = lVar59 + 1;
      } while (lVar59 != 3);
      lVar51 = lVar51 + 1;
      pcVar65 = pcVar65 + 1;
    } while (lVar51 != 3);
    lVar51 = 0;
    do {
      dst_blk->m_selectors[lVar51] = (unpacked_src_blk->m_astc).m_weights[lVar51];
      lVar51 = lVar51 + 1;
    } while (lVar51 != 0x10);
    break;
  case 8:
    uVar54 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.r;
    uVar57 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.g;
    uVar61 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.b;
    uVar58 = (ulong)(unpacked_src_blk->m_solid_color).field_0.field_0.a;
    uVar62 = (uint)*(ushort *)(&DAT_00298844 + uVar58 * 8) +
             (uint)*(ushort *)(&DAT_00298844 + uVar61 * 8) +
             (uint)*(ushort *)(&DAT_00298844 + uVar57 * 8) +
             (uint)*(ushort *)(&DAT_00298844 + uVar54 * 8);
    uVar53 = (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar58 * 4] +
             (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar61 * 4] +
             (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar57 * 4] +
             (uint)(ushort)(&g_bc7_mode_6_optimal_endpoints)[uVar54 * 4];
    if ((uVar53 == 0) || (uVar62 == 0)) {
      dst_blk->m_mode = 6;
      lVar59 = 0;
      lVar51 = (ulong)(uVar62 < uVar53) * 4;
      do {
        dst_blk->m_low[0].m_c[lVar59] =
             (&DAT_00298842)
             [lVar51 + (ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar59 + 8) * 8];
        dst_blk->m_high[0].m_c[lVar59] =
             (&DAT_00298843)
             [lVar51 + (ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar59 + 8) * 8];
        lVar59 = lVar59 + 1;
      } while (lVar59 != 4);
      dst_blk->m_pbits[0][0] = (uint)(uVar62 < uVar53);
      dst_blk->m_pbits[0][1] = (uint)(uVar62 < uVar53);
      builtin_memcpy(dst_blk->m_selectors,
                     "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05",0x10);
    }
    else {
      dst_blk->m_mode = 5;
      lVar51 = 0;
      do {
        dst_blk->m_low[0].m_c[lVar51] =
             (&DAT_00299042)
             [(ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar51 + 8) * 4];
        dst_blk->m_high[0].m_c[lVar51] =
             (&DAT_00299043)
             [(ulong)*(byte *)((long)(&unpacked_src_blk->m_astc + 1) + lVar51 + 8) * 4];
        lVar51 = lVar51 + 1;
      } while (lVar51 != 3);
      builtin_memcpy(dst_blk->m_selectors,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
      uVar48 = (unpacked_src_blk->m_solid_color).field_0.field_0.a;
      dst_blk->m_low[0].m_c[3] = uVar48;
      dst_blk->m_high[0].m_c[3] = uVar48;
    }
    break;
  case 9:
  case 0x10:
    dst_blk->m_mode = 7;
    dst_blk->m_partition =
         (uint)(byte)g_astc_bc7_common_partitions2[(ulong)unpacked_src_blk->m_common_pattern * 6];
    local_58 = (color_quad_u8 *)
               (ulong)(byte)g_astc_bc7_common_partitions2
                            [(ulong)unpacked_src_blk->m_common_pattern * 6 + 4];
    local_50 = uVar54 - 0xf;
    uVar54 = 0;
    local_48._0_4_ = 0x437f0000;
    local_48._4_4_ = 0x437f0000;
    uStack_40 = 0x437f0000;
    uStack_3c = 0x437f0000;
    bVar47 = true;
    local_38 = (ulong)bVar1 * 0x200;
    do {
      bVar56 = bVar47;
      if (local_50 < 3) {
        fStack_70 = (float)(byte)g_astc_unquant
                                 [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 4 + 1] * 2
                                  + (ulong)bVar1 * 0x200] / 255.0;
        local_78 = CONCAT44(fStack_70,fStack_70);
        auVar70._0_4_ =
             (float)(byte)g_astc_unquant
                          [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 4] * 2 +
                           (ulong)bVar1 * 0x200];
        auVar70._4_4_ = auVar70._0_4_;
        auVar70._8_4_ = auVar70._0_4_;
        auVar70._12_4_ =
             (float)(byte)g_astc_unquant
                          [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 4 + 2] * 2 +
                           (ulong)bVar1 * 0x200];
        auVar86._4_4_ = local_48._4_4_;
        auVar86._0_4_ = (undefined4)local_48;
        auVar86._8_4_ = uStack_40;
        auVar86._12_4_ = uStack_3c;
        _local_68 = divps(auVar70,auVar86);
        lVar51 = uVar54 * 4 + 3;
      }
      else {
        auVar30[0xc] = g_astc_unquant
                       [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 8 + 6] * 2 + local_38
                       ];
        auVar30._0_12_ = ZEXT712(0);
        auVar68._0_4_ =
             (float)(byte)g_astc_unquant
                          [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 8] * 2 + local_38]
        ;
        auVar68._4_4_ =
             (float)(byte)g_astc_unquant
                          [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 8 + 2] * 2 +
                           local_38];
        auVar68._8_4_ =
             (float)(int)CONCAT32(auVar30._10_3_,
                                  (ushort)(byte)g_astc_unquant
                                                [(ulong)(unpacked_src_blk->m_astc).m_endpoints
                                                        [uVar54 * 8 + 4] * 2 + local_38]);
        auVar68._12_4_ = (float)(uint3)(auVar30._10_3_ >> 0x10);
        _local_68 = divps(auVar68,_DAT_001e3920);
        auVar71._0_4_ =
             (float)(byte)g_astc_unquant
                          [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 8 + 1] * 2 +
                           local_38];
        auVar71._4_4_ =
             (float)(byte)g_astc_unquant
                          [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 8 + 3] * 2 +
                           local_38];
        auVar71._8_8_ = 0;
        auVar68 = divps(auVar71,_DAT_001e3930);
        local_78 = auVar68._0_8_;
        fStack_70 = (float)(byte)g_astc_unquant
                                 [(ulong)(unpacked_src_blk->m_astc).m_endpoints[uVar54 * 8 + 5] * 2
                                  + local_38] / 255.0;
        lVar51 = uVar54 * 8 + 7;
      }
      fStack_6c = (float)(byte)g_astc_unquant
                               [(ulong)(unpacked_src_blk->m_astc).m_endpoints[lVar51] * 2 +
                                (ulong)bVar1 * 0x200] / 255.0;
      local_80[0] = 0;
      local_80[1] = 0;
      local_88.m_c[0] = '\0';
      local_88.m_c[1] = '\0';
      local_88.m_c[2] = '\0';
      local_88.m_c[3] = '\0';
      local_84.m_c[0] = '\0';
      local_84.m_c[1] = '\0';
      local_84.m_c[2] = '\0';
      local_84.m_c[3] = '\0';
      determine_unique_pbits(4,5,(float *)local_68,(float *)&local_78,&local_88,&local_84,local_80);
      uVar54 = uVar54 ^ (ulong)local_58;
      *&dst_blk->m_low[uVar54].m_c = local_88.m_c;
      *&dst_blk->m_high[uVar54].m_c = local_84.m_c;
      dst_blk->m_pbits[uVar54] = local_80;
      uVar54 = 1;
      bVar47 = false;
    } while (bVar56);
    lVar51 = 0;
    do {
      dst_blk->m_selectors[lVar51] = (unpacked_src_blk->m_astc).m_weights[lVar51];
      lVar51 = lVar51 + 1;
    } while (lVar51 != 0x10);
  }
  return true;
}

Assistant:

bool transcode_uastc_to_bc7(const unpacked_uastc_block& unpacked_src_blk, bc7_optimization_results& dst_blk)
	{
		memset(&dst_blk, 0, sizeof(dst_blk));

		const uint32_t mode = unpacked_src_blk.m_mode;

		const uint32_t endpoint_range = g_uastc_mode_endpoint_ranges[mode];
		const uint32_t total_comps = g_uastc_mode_comps[mode];

		switch (mode)
		{
		case 0:
		case 5:
		case 10:
		case 12:
		case 14:
		case 15:
		case 18:
		{
			// MODE 0: DualPlane: 0, WeightRange: 8 (16), Subsets: 1, EndpointRange: 19 (192) - BC7 MODE6 RGB
			// MODE 5: DualPlane: 0, WeightRange : 5 (8), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE6 RGB
			// MODE 10 DualPlane: 0, WeightRange: 8 (16), Subsets: 1, EndpointRange: 13 (48) - BC7 MODE6
			// MODE 12: DualPlane: 0, WeightRange : 5 (8), Subsets : 1, EndpointRange : 19 (192) - BC7 MODE6
			// MODE 14: DualPlane: 0, WeightRange : 2 (4), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE6
			// MODE 18: DualPlane: 0, WeightRange : 11 (32), Subsets : 1, CEM : 8, EndpointRange : 11 (32) - BC7 MODE6
			// MODE 15: DualPlane: 0, WeightRange : 8 (16), Subsets : 1, CEM : 4 (LA Direct), EndpointRange : 20 (256) - BC7 MODE6
			dst_blk.m_mode = 6;

			float xl[4], xh[4];
			if (total_comps == 2)
			{
				xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant / 255.0f;
				xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant / 255.0f;

				xl[1] = xl[0];
				xh[1] = xh[0];

				xl[2] = xl[0];
				xh[2] = xh[0];

				xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant / 255.0f;
				xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant / 255.0f;
			}
			else
			{
				xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant / 255.0f;
				xl[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant / 255.0f;
				xl[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[4]].m_unquant / 255.0f;

				xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant / 255.0f;
				xh[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant / 255.0f;
				xh[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[5]].m_unquant / 255.0f;

				if (total_comps == 4)
				{
					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[6]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[7]].m_unquant / 255.0f;
				}
				else
				{
					xl[3] = 1.0f;
					xh[3] = 1.0f;
				}
			}

			uint32_t best_pbits[2];
			color_quad_u8 bestMinColor, bestMaxColor;
			determine_unique_pbits((total_comps == 2) ? 4 : total_comps, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

			dst_blk.m_low[0] = bestMinColor;
			dst_blk.m_high[0] = bestMaxColor;

			if (total_comps == 3)
			{
				dst_blk.m_low[0].m_c[3] = 127;
				dst_blk.m_high[0].m_c[3] = 127;
			}

			dst_blk.m_pbits[0][0] = best_pbits[0];
			dst_blk.m_pbits[0][1] = best_pbits[1];

			if (mode == 18)
			{
				const uint8_t s_bc7_5_to_4[32] = { 0, 0, 1, 1, 2, 2, 3, 3, 4, 4, 5, 5, 6, 6, 6, 7, 8, 9, 9, 9, 10, 10, 11, 11, 12, 12, 13, 13, 14, 14, 15, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_5_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else if (mode == 14)
			{
				const uint8_t s_bc7_2_to_4[4] = { 0, 5, 10, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_2_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else if ((mode == 5) || (mode == 12))
			{
				const uint8_t s_bc7_3_to_4[8] = { 0, 2, 4, 6, 9, 11, 13, 15 };
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = s_bc7_3_to_4[unpacked_src_blk.m_astc.m_weights[i]];
			}
			else
			{
				for (uint32_t i = 0; i < 16; i++)
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];
			}

			break;
		}
		case 1:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE3
			// Mode 1 uses endpoint range 20 - no need to use ASTC dequant tables.
			dst_blk.m_mode = 3;

			float xl[4], xh[4];
			xl[0] = unpacked_src_blk.m_astc.m_endpoints[0] / 255.0f;
			xl[1] = unpacked_src_blk.m_astc.m_endpoints[2] / 255.0f;
			xl[2] = unpacked_src_blk.m_astc.m_endpoints[4] / 255.0f;
			xl[3] = 1.0f;

			xh[0] = unpacked_src_blk.m_astc.m_endpoints[1] / 255.0f;
			xh[1] = unpacked_src_blk.m_astc.m_endpoints[3] / 255.0f;
			xh[2] = unpacked_src_blk.m_astc.m_endpoints[5] / 255.0f;
			xh[3] = 1.0f;

			uint32_t best_pbits[2];
			color_quad_u8 bestMinColor, bestMaxColor;
			memset(&bestMinColor, 0, sizeof(bestMinColor));
			memset(&bestMaxColor, 0, sizeof(bestMaxColor));
			determine_unique_pbits(3, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

			for (uint32_t i = 0; i < 3; i++)
			{
				dst_blk.m_low[0].m_c[i] = bestMinColor.m_c[i];
				dst_blk.m_high[0].m_c[i] = bestMaxColor.m_c[i];
				dst_blk.m_low[1].m_c[i] = bestMinColor.m_c[i];
				dst_blk.m_high[1].m_c[i] = bestMaxColor.m_c[i];
			}
			dst_blk.m_pbits[0][0] = best_pbits[0];
			dst_blk.m_pbits[0][1] = best_pbits[1];
			dst_blk.m_pbits[1][0] = best_pbits[0];
			dst_blk.m_pbits[1][1] = best_pbits[1];

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 2:
		{
			// 2. DualPlane: 0, WeightRange : 5 (8), Subsets : 2, EndpointRange : 8 (16) - BC7 MODE1 
			dst_blk.m_mode = 1;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			float xl[4], xh[4];
			xl[3] = 1.0f;
			xh[3] = 1.0f;

			for (uint32_t subset = 0; subset < 2; subset++)
			{
				for (uint32_t i = 0; i < 3; i++)
				{
					uint32_t v = unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6];
					v = (v << 4) | v;
					xl[i] = v / 255.0f;

					v = unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6 + 1];
					v = (v << 4) | v;
					xh[i] = v / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_shared_pbits(3, 6, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - subset) : subset;

				for (uint32_t i = 0; i < 3; i++)
				{
					dst_blk.m_low[bc7_subset_index].m_c[i] = bestMinColor.m_c[i];
					dst_blk.m_high[bc7_subset_index].m_c[i] = bestMaxColor.m_c[i];
				}

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
			} // subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 3:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 3, EndpointRange : 7 (12) - BC7 MODE2
			dst_blk.m_mode = 2;
			dst_blk.m_partition = g_astc_bc7_common_partitions3[unpacked_src_blk.m_common_pattern].m_bc7;

			const uint32_t perm = g_astc_bc7_common_partitions3[unpacked_src_blk.m_common_pattern].m_astc_to_bc7_perm;

			for (uint32_t subset = 0; subset < 3; subset++)
			{
				for (uint32_t comp = 0; comp < 3; comp++)
				{
					uint32_t lo = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[comp * 2 + 0 + subset * 6]].m_unquant;
					uint32_t hi = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[comp * 2 + 1 + subset * 6]].m_unquant;

					// TODO: I think this can be improved by using tables like Basis Universal does with ETC1S conversion.
					lo = (lo * 31 + 127) / 255;
					hi = (hi * 31 + 127) / 255;

					const uint32_t bc7_subset_index = g_astc_to_bc7_partition_index_perm_tables[perm][subset];

					dst_blk.m_low[bc7_subset_index].m_c[comp] = (uint8_t)lo;
					dst_blk.m_high[bc7_subset_index].m_c[comp] = (uint8_t)hi;
				}
			}

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 4:
		{
			// 4. DualPlane: 0, WeightRange: 2 (4), Subsets: 2, EndpointRange: 12 (40) - BC7 MODE3
			dst_blk.m_mode = 3;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			float xl[4], xh[4];
			xl[3] = 1.0f;
			xh[3] = 1.0f;

			for (uint32_t subset = 0; subset < 2; subset++)
			{
				for (uint32_t i = 0; i < 3; i++)
				{
					xl[i] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6]].m_unquant / 255.0f;
					xh[i] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[i * 2 + subset * 6 + 1]].m_unquant / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_unique_pbits(3, 7, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - subset) : subset;

				for (uint32_t i = 0; i < 3; i++)
				{
					dst_blk.m_low[bc7_subset_index].m_c[i] = bestMinColor.m_c[i];
					dst_blk.m_high[bc7_subset_index].m_c[i] = bestMaxColor.m_c[i];
				}
				dst_blk.m_low[bc7_subset_index].m_c[3] = 127;
				dst_blk.m_high[bc7_subset_index].m_c[3] = 127;

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
				dst_blk.m_pbits[bc7_subset_index][1] = best_pbits[1];

			} // subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case 6:
		case 11:
		case 13:
		case 17:
		{
			// MODE 6: DualPlane: 1, WeightRange : 2 (4), Subsets : 1, EndpointRange : 18 (160) - BC7 MODE5 RGB
			// MODE 11: DualPlane: 1, WeightRange: 2 (4), Subsets: 1, EndpointRange: 13 (48) - BC7 MODE5
			// MODE 13: DualPlane: 1, WeightRange: 0 (2), Subsets : 1, EndpointRange : 20 (256) - BC7 MODE5
			// MODE 17: DualPlane: 1, WeightRange: 2 (4), Subsets: 1, CEM: 4 (LA Direct), EndpointRange: 20 (256) - BC7 MODE5
			dst_blk.m_mode = 5;
			dst_blk.m_rotation = (unpacked_src_blk.m_astc.m_ccs + 1) & 3;

			if (total_comps == 2)
			{
				assert(unpacked_src_blk.m_astc.m_ccs == 3);

				dst_blk.m_low->m_c[0] = (uint8_t)((g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0]].m_unquant * 127 + 127) / 255);
				dst_blk.m_high->m_c[0] = (uint8_t)((g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1]].m_unquant * 127 + 127) / 255);

				dst_blk.m_low->m_c[1] = dst_blk.m_low->m_c[0];
				dst_blk.m_high->m_c[1] = dst_blk.m_high->m_c[0];

				dst_blk.m_low->m_c[2] = dst_blk.m_low->m_c[0];
				dst_blk.m_high->m_c[2] = dst_blk.m_high->m_c[0];

				dst_blk.m_low->m_c[3] = (uint8_t)(g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2]].m_unquant);
				dst_blk.m_high->m_c[3] = (uint8_t)(g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3]].m_unquant);
			}
			else
			{
				for (uint32_t astc_comp = 0; astc_comp < 4; astc_comp++)
				{
					uint32_t bc7_comp = astc_comp;
					// ASTC and BC7 handle dual plane component rotations differently:
					// ASTC: 2nd plane separately interpolates the CCS channel.
					// BC7: 2nd plane channel is swapped with alpha, 2nd plane controls alpha interpolation, then we swap alpha with the desired channel.
					if (astc_comp == (uint32_t)unpacked_src_blk.m_astc.m_ccs)
						bc7_comp = 3;
					else if (astc_comp == 3)
						bc7_comp = unpacked_src_blk.m_astc.m_ccs;

					uint32_t l = 255, h = 255;
					if (astc_comp < total_comps)
					{
						l = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[astc_comp * 2 + 0]].m_unquant;
						h = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[astc_comp * 2 + 1]].m_unquant;
					}

					if (bc7_comp < 3)
					{
						l = (l * 127 + 127) / 255;
						h = (h * 127 + 127) / 255;
					}

					dst_blk.m_low->m_c[bc7_comp] = (uint8_t)l;
					dst_blk.m_high->m_c[bc7_comp] = (uint8_t)h;
				}
			}

			if (mode == 13)
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2] ? 3 : 0;
					dst_blk.m_alpha_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2 + 1] ? 3 : 0;
				}
			}
			else
			{
				for (uint32_t i = 0; i < 16; i++)
				{
					dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2];
					dst_blk.m_alpha_selectors[i] = unpacked_src_blk.m_astc.m_weights[i * 2 + 1];
				}
			}

			break;
		}
		case 7:
		{
			// DualPlane: 0, WeightRange : 2 (4), Subsets : 2, EndpointRange : 12 (40) - BC7 MODE2
			dst_blk.m_mode = 2;
			dst_blk.m_partition = g_bc7_3_astc2_common_partitions[unpacked_src_blk.m_common_pattern].m_bc73;

			const uint32_t common_pattern_k = g_bc7_3_astc2_common_partitions[unpacked_src_blk.m_common_pattern].k;

			for (uint32_t bc7_part = 0; bc7_part < 3; bc7_part++)
			{
				const uint32_t astc_part = bc7_convert_partition_index_3_to_2(bc7_part, common_pattern_k);

				for (uint32_t c = 0; c < 3; c++)
				{
					dst_blk.m_low[bc7_part].m_c[c] = (g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[c * 2 + 0 + astc_part * 6]].m_unquant * 31 + 127) / 255;
					dst_blk.m_high[bc7_part].m_c[c] = (g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[c * 2 + 1 + astc_part * 6]].m_unquant * 31 + 127) / 255;
				}
			}

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		case UASTC_MODE_INDEX_SOLID_COLOR:
		{
			// Void-Extent: Solid Color RGBA (BC7 MODE5 or MODE6)
			const color32& solid_color = unpacked_src_blk.m_solid_color;

			uint32_t best_err0 = g_bc7_mode_6_optimal_endpoints[solid_color.r][0].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.g][0].m_error +
				g_bc7_mode_6_optimal_endpoints[solid_color.b][0].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.a][0].m_error;

			uint32_t best_err1 = g_bc7_mode_6_optimal_endpoints[solid_color.r][1].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.g][1].m_error +
				g_bc7_mode_6_optimal_endpoints[solid_color.b][1].m_error + g_bc7_mode_6_optimal_endpoints[solid_color.a][1].m_error;

			if (best_err0 > 0 && best_err1 > 0)
			{
				dst_blk.m_mode = 5;

				for (uint32_t c = 0; c < 3; c++)
				{
					dst_blk.m_low[0].m_c[c] = g_bc7_mode_5_optimal_endpoints[solid_color.c[c]].m_lo;
					dst_blk.m_high[0].m_c[c] = g_bc7_mode_5_optimal_endpoints[solid_color.c[c]].m_hi;
				}

				memset(dst_blk.m_selectors, BC7ENC_MODE_5_OPTIMAL_INDEX, 16);

				dst_blk.m_low[0].m_c[3] = solid_color.c[3];
				dst_blk.m_high[0].m_c[3] = solid_color.c[3];

				//memset(dst_blk.m_alpha_selectors, 0, 16);
			}
			else
			{
				dst_blk.m_mode = 6;

				uint32_t best_p = 0;
				if (best_err1 < best_err0)
					best_p = 1;

				for (uint32_t c = 0; c < 4; c++)
				{
					dst_blk.m_low[0].m_c[c] = g_bc7_mode_6_optimal_endpoints[solid_color.c[c]][best_p].m_lo;
					dst_blk.m_high[0].m_c[c] = g_bc7_mode_6_optimal_endpoints[solid_color.c[c]][best_p].m_hi;
				}

				dst_blk.m_pbits[0][0] = best_p;
				dst_blk.m_pbits[0][1] = best_p;
				memset(dst_blk.m_selectors, BC7ENC_MODE_6_OPTIMAL_INDEX, 16);
			}

			break;
		}
		case 9:
		case 16:
		{
			// 9. DualPlane: 0, WeightRange : 2 (4), Subsets : 2, EndpointRange : 8 (16) - BC7 MODE7
			// 16. DualPlane: 0, WeightRange: 2 (4), Subsets: 2, CEM: 4 (LA Direct), EndpointRange: 20 (256) - BC7 MODE7

			dst_blk.m_mode = 7;
			dst_blk.m_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_bc7;

			const bool invert_partition = g_astc_bc7_common_partitions2[unpacked_src_blk.m_common_pattern].m_invert;

			for (uint32_t astc_subset = 0; astc_subset < 2; astc_subset++)
			{
				float xl[4], xh[4];

				if (total_comps == 2)
				{
					xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0 + astc_subset * 4]].m_unquant / 255.0f;
					xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1 + astc_subset * 4]].m_unquant / 255.0f;

					xl[1] = xl[0];
					xh[1] = xh[0];

					xl[2] = xl[0];
					xh[2] = xh[0];

					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2 + astc_subset * 4]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3 + astc_subset * 4]].m_unquant / 255.0f;
				}
				else
				{
					xl[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[0 + astc_subset * 8]].m_unquant / 255.0f;
					xl[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[2 + astc_subset * 8]].m_unquant / 255.0f;
					xl[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[4 + astc_subset * 8]].m_unquant / 255.0f;
					xl[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[6 + astc_subset * 8]].m_unquant / 255.0f;

					xh[0] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[1 + astc_subset * 8]].m_unquant / 255.0f;
					xh[1] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[3 + astc_subset * 8]].m_unquant / 255.0f;
					xh[2] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[5 + astc_subset * 8]].m_unquant / 255.0f;
					xh[3] = g_astc_unquant[endpoint_range][unpacked_src_blk.m_astc.m_endpoints[7 + astc_subset * 8]].m_unquant / 255.0f;
				}

				uint32_t best_pbits[2] = { 0, 0 };
				color_quad_u8 bestMinColor, bestMaxColor;
				memset(&bestMinColor, 0, sizeof(bestMinColor));
				memset(&bestMaxColor, 0, sizeof(bestMaxColor));
				determine_unique_pbits(4, 5, xl, xh, bestMinColor, bestMaxColor, best_pbits);

				const uint32_t bc7_subset_index = invert_partition ? (1 - astc_subset) : astc_subset;

				dst_blk.m_low[bc7_subset_index] = bestMinColor;
				dst_blk.m_high[bc7_subset_index] = bestMaxColor;

				dst_blk.m_pbits[bc7_subset_index][0] = best_pbits[0];
				dst_blk.m_pbits[bc7_subset_index][1] = best_pbits[1];
			} // astc_subset

			for (uint32_t i = 0; i < 16; i++)
				dst_blk.m_selectors[i] = unpacked_src_blk.m_astc.m_weights[i];

			break;
		}
		default:
			return false;
		}

		return true;
	}